

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nsh_line_buffer.cpp
# Opt level: O2

void __thiscall
NshLineBufferEraseLastChar_Success_Test::~NshLineBufferEraseLastChar_Success_Test
          (NshLineBufferEraseLastChar_Success_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(NshLineBufferEraseLastChar, Success)
{
    nsh_line_buffer_t line;
    nsh_line_buffer_reset(&line);

    nsh_line_buffer_append_char(&line, 'a');

    ASSERT_EQ(line.size, 1);
    nsh_line_buffer_erase_last_char(&line);
    ASSERT_EQ(line.size, 0);
}